

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::CustomLayerParams::ByteSizeLong(CustomLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  *pMVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  const_pointer pvVar5;
  ulong uVar6;
  string *psVar7;
  long lVar8;
  undefined1 local_70 [4];
  int cached_size;
  undefined1 local_58 [8];
  const_iterator it;
  WeightParams *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::WeightParams> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  CustomLayerParams *this_local;
  
  iVar2 = _internal_weights_size(this);
  sStack_18 = (long)iVar2 * 2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::begin
                     (&this->weights_);
  msg = (WeightParams *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::end
                  (&this->weights_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::operator!=
                           (&__end2,(iterator *)&msg), bVar1) {
    it.it_.bucket_index_ =
         (size_type)
         google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::WeightParams>
         ::operator*(&__end2);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>((WeightParams *)it.it_.bucket_index_);
    sStack_18 = sVar3 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::
    operator++(&__end2);
  }
  iVar2 = _internal_parameters_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_18 = sVar3 * 2 + sStack_18;
  pMVar4 = _internal_parameters_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  ::begin((const_iterator *)local_58,pMVar4);
  while( true ) {
    pMVar4 = _internal_parameters_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
    ::end((const_iterator *)local_70,pMVar4);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_58,(const_iterator *)local_70);
    if (!bVar1) break;
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
          ::const_iterator::operator->((const_iterator *)local_58);
    pvVar5 = google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
             ::const_iterator::operator->((const_iterator *)local_58);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(key,(CustomLayerParams_CustomLayerParamValue *)(pvVar5 + 0x20));
    sStack_18 = sVar3 + sStack_18;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
    ::const_iterator::operator++((const_iterator *)local_58);
  }
  _internal_classname_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    psVar7 = _internal_classname_abi_cxx11_(this);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  _internal_description_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    psVar7 = _internal_description_abi_cxx11_(this);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    sStack_18 = sVar3 + 2 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar8 = std::__cxx11::string::size();
    sStack_18 = lVar8 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t CustomLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.WeightParams weights = 20;
  total_size += 2UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_parameters_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::const_iterator
      it = this->_internal_parameters().begin();
      it != this->_internal_parameters().end(); ++it) {
    total_size += CustomLayerParams_ParametersEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string className = 10;
  if (!this->_internal_classname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_classname());
  }

  // string description = 40;
  if (!this->_internal_description().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_description());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}